

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::InlineCache::CopyTo
          (InlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,InlineCache *clone)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  InlineCache *clone_local;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  InlineCache *this_local;
  
  VerifyRegistrationForInvalidation(this,scriptContext,propertyId);
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  if (clone == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x1e4,"(clone != nullptr)","clone != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->invalidationListSlotPtr != (InlineCache **)0x0) &&
     (clone->invalidationListSlotPtr == (InlineCache **)0x0)) {
    bVar2 = NeedsToBeRegisteredForProtoInvalidation(this);
    if (bVar2) {
      ScriptContext::RegisterProtoInlineCache(scriptContext,clone,propertyId);
    }
    else {
      bVar2 = NeedsToBeRegisteredForStoreFieldInvalidation(this);
      if (bVar2) {
        ScriptContext::RegisterStoreFieldInlineCache(scriptContext,clone,propertyId);
      }
    }
  }
  iVar3 = memcmp(clone,this,0x18);
  if (iVar3 != 0) {
    (clone->u).local.type = (this->u).local.type;
    (clone->u).local.typeWithoutProperty = (this->u).local.typeWithoutProperty;
    (clone->u).proto.prototypeObject = (this->u).proto.prototypeObject;
  }
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  return;
}

Assistant:

void InlineCache::CopyTo(PropertyId propertyId, ScriptContext * scriptContext, InlineCache * const clone)
    {
        DebugOnly(VerifyRegistrationForInvalidation(this, scriptContext, propertyId));
        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
        Assert(clone != nullptr);

        // Note, the Register methods can throw due to OOM, so we need to do it before the inline cache is copied below.
        if (this->invalidationListSlotPtr != nullptr && clone->invalidationListSlotPtr == nullptr)
        {
            if (this->NeedsToBeRegisteredForProtoInvalidation())
            {
                scriptContext->RegisterProtoInlineCache(clone, propertyId);
            }
            else if (this->NeedsToBeRegisteredForStoreFieldInvalidation())
            {
                scriptContext->RegisterStoreFieldInlineCache(clone, propertyId);
            }
        }

#if DBG
        // inline cache pages might been locked after ZeroAll
        if (memcmp(&clone->u, &this->u, sizeof(this->u)) != 0)
#endif
        {
            clone->u = this->u;
        }

        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
    }